

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_flow_collection_start(yaml_parser_t *parser,yaml_token_type_t type)

{
  size_t *psVar1;
  yaml_token_t **tail;
  byte bVar2;
  yaml_simple_key_t *pyVar3;
  size_t sVar4;
  byte *pbVar5;
  size_t sVar6;
  yaml_token_t *pyVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  yaml_mark_t start_mark;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  
  iVar12 = yaml_parser_save_simple_key(parser);
  if (iVar12 == 0) {
    return 0;
  }
  if (((parser->simple_keys).top != (parser->simple_keys).end) ||
     (iVar12 = yaml_stack_extend(&(parser->simple_keys).start,&(parser->simple_keys).top,
                                 &(parser->simple_keys).end), iVar12 != 0)) {
    pyVar3 = (parser->simple_keys).top;
    (parser->simple_keys).top = pyVar3 + 1;
    (pyVar3->mark).index = 0;
    (pyVar3->mark).line = 0;
    pyVar3->possible = 0;
    pyVar3->required = 0;
    pyVar3->token_number = 0;
    (pyVar3->mark).column = 0;
    if (parser->flow_level != 0x7fffffff) {
      parser->flow_level = parser->flow_level + 1;
      parser->simple_key_allowed = 1;
      sVar4 = (parser->mark).column;
      sVar8 = (parser->mark).index;
      sVar9 = (parser->mark).line;
      (parser->mark).index = (parser->mark).index + 1;
      psVar1 = &(parser->mark).column;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 1;
      pbVar5 = (parser->buffer).pointer;
      bVar2 = *pbVar5;
      lVar13 = 1;
      if ((((char)bVar2 < '\0') && (lVar13 = 2, (bVar2 & 0xe0) != 0xc0)) &&
         (lVar13 = 3, (bVar2 & 0xf0) != 0xe0)) {
        lVar13 = (ulong)((bVar2 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar5 + lVar13;
      sVar6 = (parser->mark).column;
      sVar10 = (parser->mark).index;
      sVar11 = (parser->mark).line;
      uStack_6c = (undefined4)sVar4;
      uStack_68 = (undefined4)(sVar4 >> 0x20);
      local_78 = (undefined4)(sVar8 >> 0x20);
      uStack_74 = (undefined4)sVar9;
      uStack_70 = (undefined4)(sVar9 >> 0x20);
      tail = &(parser->tokens).tail;
      if (((parser->tokens).tail != (parser->tokens).end) ||
         (iVar12 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                     &(parser->tokens).end), iVar12 != 0)) {
        pyVar7 = *tail;
        *tail = pyVar7 + 1;
        pyVar7->type = type;
        *(undefined8 *)&pyVar7->field_0x4 = 0;
        *(undefined8 *)((long)&(pyVar7->data).alias.value + 4) = 0;
        *(undefined8 *)((long)&(pyVar7->data).tag.suffix + 4) = 0;
        *(size_t *)((long)&pyVar7->data + 0x14) = sVar8 << 0x20;
        *(ulong *)((long)&(pyVar7->start_mark).index + 4) = CONCAT44(uStack_74,local_78);
        *(ulong *)((long)&(pyVar7->start_mark).line + 4) = CONCAT44(uStack_6c,uStack_70);
        *(undefined4 *)((long)&(pyVar7->start_mark).column + 4) = uStack_68;
        (pyVar7->end_mark).index = sVar10;
        (pyVar7->end_mark).line = sVar11;
        (pyVar7->end_mark).column = sVar6;
        return 1;
      }
    }
  }
  parser->error = YAML_MEMORY_ERROR;
  return 0;
}

Assistant:

static int
yaml_parser_fetch_flow_collection_start(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* The indicators '[' and '{' may start a simple key. */

    if (!yaml_parser_save_simple_key(parser))
        return 0;

    /* Increase the flow level. */

    if (!yaml_parser_increase_flow_level(parser))
        return 0;

    /* A simple key may follow the indicators '[' and '{'. */

    parser->simple_key_allowed = 1;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-SEQUENCE-START of FLOW-MAPPING-START token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}